

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int get_gf_active_quality_no_rc(int gfu_boost,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  int *arfgf_high_motion_minq;
  int *arfgf_low_motion_minq;
  int *local_20;
  int *local_18;
  
  if (in_EDX == 8) {
    local_18 = arfgf_low_motion_minq_8;
  }
  else if (in_EDX == 10) {
    local_18 = arfgf_low_motion_minq_10;
  }
  else if (in_EDX == 0xc) {
    local_18 = arfgf_low_motion_minq_12;
  }
  else {
    local_18 = (int *)0x0;
  }
  if (in_EDX == 8) {
    local_20 = arfgf_high_motion_minq_8;
  }
  else if (in_EDX == 10) {
    local_20 = arfgf_high_motion_minq_10;
  }
  else if (in_EDX == 0xc) {
    local_20 = arfgf_high_motion_minq_12;
  }
  else {
    local_20 = (int *)0x0;
  }
  iVar1 = get_active_quality(in_ESI,in_EDI,gf_low,gf_high,local_18,local_20);
  return iVar1;
}

Assistant:

static int get_gf_active_quality_no_rc(int gfu_boost, int q,
                                       aom_bit_depth_t bit_depth) {
  int *arfgf_low_motion_minq;
  int *arfgf_high_motion_minq;
  ASSIGN_MINQ_TABLE(bit_depth, arfgf_low_motion_minq);
  ASSIGN_MINQ_TABLE(bit_depth, arfgf_high_motion_minq);
  return get_active_quality(q, gfu_boost, gf_low, gf_high,
                            arfgf_low_motion_minq, arfgf_high_motion_minq);
}